

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcpdial.c
# Opt level: O2

void nni_posix_tcp_dial_cb(void *arg,uint ev)

{
  nni_mtx *mtx;
  byte bVar1;
  byte bVar2;
  long lVar3;
  nni_aio *aio;
  int iVar4;
  undefined8 in_RAX;
  nng_err *pnVar5;
  undefined8 local_38;
  socklen_t sz;
  int rv;
  
  lVar3 = *(long *)((long)arg + 0xd8);
  mtx = (nni_mtx *)(lVar3 + 0xa8);
  local_38 = in_RAX;
  nni_mtx_lock(mtx);
  aio = *(nni_aio **)((long)arg + 0xd0);
  if ((aio != (nni_aio *)0x0) && (iVar4 = nni_aio_list_active(aio), iVar4 != 0)) {
    if ((ev & 0x20) == 0) {
      local_38._0_4_ = 4;
      iVar4 = nni_posix_pfd_fd((nni_posix_pfd *)((long)arg + 0x38));
      iVar4 = getsockopt(iVar4,1,4,(void *)((long)&local_38 + 4),(socklen_t *)&local_38);
      if (iVar4 < 0) {
        pnVar5 = (nng_err *)__errno_location();
        local_38._4_4_ = *pnVar5;
      }
      if (local_38._4_4_ != NNG_OK) {
        if (local_38._4_4_ == 0x73) {
          nni_mtx_unlock(mtx);
          return;
        }
        local_38._4_4_ = nni_plat_errno(local_38._4_4_);
      }
    }
    else {
      local_38._4_4_ = NNG_ENOTSUP;
    }
    *(undefined8 *)((long)arg + 0xd0) = 0;
    nni_aio_list_remove(aio);
    nni_aio_set_prov_data(aio,(void *)0x0);
    bVar1 = *(byte *)(lVar3 + 0x19);
    bVar2 = *(byte *)(lVar3 + 0x1a);
    nni_mtx_unlock(mtx);
    if (local_38._4_4_ == NNG_OK) {
      nni_posix_tcp_start((nni_tcp_conn *)arg,(uint)bVar1,(uint)bVar2);
      nni_aio_set_output(aio,0,arg);
      nni_aio_finish(aio,NNG_OK,0);
    }
    else {
      nng_stream_close((nng_stream *)arg);
      nng_stream_free((nng_stream *)arg);
      nni_aio_finish_error(aio,local_38._4_4_);
    }
    return;
  }
  nni_mtx_unlock(mtx);
  return;
}

Assistant:

void
nni_posix_tcp_dial_cb(void *arg, unsigned ev)
{
	nni_tcp_conn   *c = arg;
	nni_tcp_dialer *d = c->dialer;
	nni_aio        *aio;
	int             rv;
	int             ka;
	int             nd;

	nni_mtx_lock(&d->mtx);
	aio = c->dial_aio;
	if ((aio == NULL) || (!nni_aio_list_active(aio))) {
		nni_mtx_unlock(&d->mtx);
		return;
	}

	if ((ev & NNI_POLL_INVAL) != 0) {
		rv = EBADF;

	} else {
		socklen_t sz = sizeof(int);
		int       fd = nni_posix_pfd_fd(&c->pfd);
		if (getsockopt(fd, SOL_SOCKET, SO_ERROR, &rv, &sz) < 0) {
			rv = errno;
		}
		if (rv == EINPROGRESS) {
			// Connection still in progress, come back
			// later.
			nni_mtx_unlock(&d->mtx);
			return;
		} else if (rv != 0) {
			rv = nni_plat_errno(rv);
		}
	}

	c->dial_aio = NULL;
	nni_aio_list_remove(aio);
	nni_aio_set_prov_data(aio, NULL);
	nd = d->nodelay ? 1 : 0;
	ka = d->keepalive ? 1 : 0;

	nni_mtx_unlock(&d->mtx);

	if (rv != 0) {
		nng_stream_close(&c->stream);
		nng_stream_free(&c->stream);
		nni_aio_finish_error(aio, rv);
		return;
	}

	nni_posix_tcp_start(c, nd, ka);
	nni_aio_set_output(aio, 0, c);
	nni_aio_finish(aio, 0, 0);
}